

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

void __thiscall EmmyDebuggerManager::Eval(EmmyDebuggerManager *this,shared_ptr<EvalContext> *ctx)

{
  shared_ptr<Debugger> debugger;
  shared_ptr<EvalContext> local_30;
  Debugger *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  GetHitBreakpoint((EmmyDebuggerManager *)&stack0xffffffffffffffe0);
  if (local_20 != (Debugger *)0x0) {
    local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ctx->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (ctx->super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Debugger::Eval(local_20,&local_30,false);
    if (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return;
}

Assistant:

void EmmyDebuggerManager::Eval(std::shared_ptr<EvalContext> ctx)
{
	auto debugger = GetHitBreakpoint();
	if (debugger)
	{
		debugger->Eval(ctx, false);
	}
}